

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_10x10(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  JSAMPLE *pJVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int aiStack_178 [82];
  
  pJVar4 = cinfo->sample_range_limit;
  pvVar5 = compptr->dct_table;
  lVar17 = 0;
  do {
    lVar23 = (long)*(short *)((long)pvVar5 + lVar17 * 2) * (long)coef_block[lVar17] * 0x2000;
    lVar10 = (long)*(short *)((long)pvVar5 + lVar17 * 2 + 0x40) * (long)coef_block[lVar17 + 0x20];
    lVar20 = lVar10 * 0x249d + lVar23 + 0x400;
    lVar22 = lVar10 * -0xdfc + lVar23 + 0x400;
    lVar11 = (long)*(short *)((long)pvVar5 + lVar17 * 2 + 0x20) * (long)coef_block[lVar17 + 0x10];
    lVar28 = (long)*(short *)((long)pvVar5 + lVar17 * 2 + 0x60) * (long)coef_block[lVar17 + 0x30];
    lVar9 = (lVar28 + lVar11) * 0x1a9a;
    lVar12 = lVar11 * 0x1071 + lVar9;
    lVar9 = lVar28 * -0x45a4 + lVar9;
    lVar11 = lVar12 + lVar20;
    lVar20 = lVar20 - lVar12;
    lVar12 = lVar9 + lVar22;
    lVar22 = lVar22 - lVar9;
    lVar28 = (long)*(short *)((long)pvVar5 + lVar17 * 2 + 0x10) * (long)coef_block[lVar17 + 8];
    lVar14 = (long)*(short *)((long)pvVar5 + lVar17 * 2 + 0x30) * (long)coef_block[lVar17 + 0x18];
    lVar25 = (long)*(short *)((long)pvVar5 + lVar17 * 2 + 0x50) * (long)coef_block[lVar17 + 0x28];
    lVar26 = (long)*(short *)((long)pvVar5 + lVar17 * 2 + 0x70) * (long)coef_block[lVar17 + 0x38];
    lVar9 = lVar26 + lVar14;
    lVar14 = lVar14 - lVar26;
    lVar26 = lVar25 * 0x2000;
    lVar15 = lVar14 * 0x9e3 + lVar26;
    lVar27 = lVar28 * 0x2cb3 + lVar9 * 0x1e6f + lVar15;
    lVar15 = lVar28 * 0x714 + lVar9 * -0x1e6f + lVar15;
    lVar26 = lVar14 * -0x19e3 + lVar26;
    iVar13 = (int)lVar28 - ((int)lVar25 + (int)lVar14);
    lVar14 = (lVar28 * 0x2853 + lVar9 * -0x12cf) - lVar26;
    lVar26 = lVar28 * 0x148c + lVar9 * -0x12cf + lVar26;
    aiStack_178[lVar17] = (int)((ulong)(lVar11 + lVar27) >> 0xb);
    aiStack_178[lVar17 + 0x48] = (int)((ulong)(lVar11 - lVar27) >> 0xb);
    aiStack_178[lVar17 + 8] = (int)((ulong)(lVar14 + lVar12) >> 0xb);
    aiStack_178[lVar17 + 0x40] = (int)((ulong)(lVar12 - lVar14) >> 0xb);
    iVar3 = (int)(lVar23 + lVar10 * -0x2d42 + 0x400U >> 0xb);
    aiStack_178[lVar17 + 0x10] = iVar3 + iVar13 * 4;
    aiStack_178[lVar17 + 0x38] = iVar3 + iVar13 * -4;
    aiStack_178[lVar17 + 0x18] = (int)((ulong)(lVar26 + lVar22) >> 0xb);
    aiStack_178[lVar17 + 0x30] = (int)((ulong)(lVar22 - lVar26) >> 0xb);
    aiStack_178[lVar17 + 0x20] = (int)((ulong)(lVar15 + lVar20) >> 0xb);
    aiStack_178[lVar17 + 0x28] = (int)((ulong)(lVar20 - lVar15) >> 0xb);
    lVar17 = lVar17 + 1;
  } while ((int)lVar17 != 8);
  uVar7 = (ulong)output_col;
  lVar17 = 0;
  do {
    iVar2 = aiStack_178[lVar17 + 1];
    iVar3 = aiStack_178[lVar17 + 4];
    iVar13 = aiStack_178[lVar17] * 0x2000;
    iVar18 = iVar13 + iVar3 * 0x249d + 0x20000;
    iVar19 = iVar3 * -0xdfc + iVar13 + 0x20000;
    iVar21 = iVar3 * -0x2d42 + iVar13 + 0x20000;
    iVar6 = (aiStack_178[lVar17 + 6] + aiStack_178[lVar17 + 2]) * 0x1a9a;
    iVar13 = aiStack_178[lVar17 + 2] * 0x1071 + iVar6;
    iVar6 = aiStack_178[lVar17 + 6] * -0x45a4 + iVar6;
    iVar3 = iVar13 + iVar18;
    iVar18 = iVar18 - iVar13;
    iVar13 = iVar6 + iVar19;
    iVar1 = aiStack_178[lVar17 + 7] + aiStack_178[lVar17 + 3];
    iVar29 = aiStack_178[lVar17 + 3] - aiStack_178[lVar17 + 7];
    iVar19 = iVar19 - iVar6;
    iVar8 = aiStack_178[lVar17 + 5] * 0x2000;
    iVar6 = iVar29 * 0x9e3 + iVar8;
    iVar24 = iVar2 * 0x2cb3 + iVar1 * 0x1e6f + iVar6;
    iVar6 = iVar2 * 0x714 + iVar1 * -0x1e6f + iVar6;
    iVar8 = iVar29 * -0x19e3 + iVar8;
    iVar16 = iVar2 - (iVar29 + aiStack_178[lVar17 + 5]);
    iVar29 = (iVar2 * 0x2853 + iVar1 * -0x12cf) - iVar8;
    iVar8 = iVar2 * 0x148c + iVar1 * -0x12cf + iVar8;
    lVar11 = *(long *)((long)output_buf + lVar17);
    *(JSAMPLE *)(lVar11 + uVar7) = pJVar4[(ulong)((uint)(iVar24 + iVar3) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 9 + uVar7) =
         pJVar4[(ulong)((uint)(iVar3 - iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 1 + uVar7) =
         pJVar4[(ulong)((uint)(iVar29 + iVar13) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 8 + uVar7) =
         pJVar4[(ulong)((uint)(iVar13 - iVar29) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 2 + uVar7) =
         pJVar4[(ulong)((uint)(iVar16 * 0x2000 + iVar21) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 7 + uVar7) =
         pJVar4[(ulong)((uint)(iVar21 + iVar16 * -0x2000) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 3 + uVar7) =
         pJVar4[(ulong)((uint)(iVar19 + iVar8) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 6 + uVar7) =
         pJVar4[(ulong)((uint)(iVar19 - iVar8) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 4 + uVar7) =
         pJVar4[(ulong)((uint)(iVar6 + iVar18) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar11 + 5 + uVar7) =
         pJVar4[(ulong)((uint)(iVar18 - iVar6) >> 0x12 & 0x3ff) + 0x80];
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x50);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_10x10(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24;
  JLONG z1, z2, z3, z4, z5;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 10];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z3 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z3 += ONE << (CONST_BITS - PASS1_BITS - 1);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z1 = MULTIPLY(z4, FIX(1.144122806));         /* c4 */
    z2 = MULTIPLY(z4, FIX(0.437016024));         /* c8 */
    tmp10 = z3 + z1;
    tmp11 = z3 - z2;

    tmp22 = RIGHT_SHIFT(z3 - LEFT_SHIFT(z1 - z2, 1),
                        CONST_BITS - PASS1_BITS); /* c0 = (c4-c8)*2 */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));    /* c6 */
    tmp12 = z1 + MULTIPLY(z2, FIX(0.513743148)); /* c2-c6 */
    tmp13 = z1 - MULTIPLY(z3, FIX(2.176250899)); /* c2+c6 */

    tmp20 = tmp10 + tmp12;
    tmp24 = tmp10 - tmp12;
    tmp21 = tmp11 + tmp13;
    tmp23 = tmp11 - tmp13;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z2 + z4;
    tmp13 = z2 - z4;

    tmp12 = MULTIPLY(tmp13, FIX(0.309016994));        /* (c3-c7)/2 */
    z5 = LEFT_SHIFT(z3, CONST_BITS);

    z2 = MULTIPLY(tmp11, FIX(0.951056516));           /* (c3+c7)/2 */
    z4 = z5 + tmp12;

    tmp10 = MULTIPLY(z1, FIX(1.396802247)) + z2 + z4; /* c1 */
    tmp14 = MULTIPLY(z1, FIX(0.221231742)) - z2 + z4; /* c9 */

    z2 = MULTIPLY(tmp11, FIX(0.587785252));           /* (c1-c9)/2 */
    z4 = z5 - tmp12 - LEFT_SHIFT(tmp13, CONST_BITS - 1);

    tmp12 = LEFT_SHIFT(z1 - tmp13 - z3, PASS1_BITS);

    tmp11 = MULTIPLY(z1, FIX(1.260073511)) - z2 - z4; /* c3 */
    tmp13 = MULTIPLY(z1, FIX(0.642039522)) - z2 + z4; /* c7 */

    /* Final output stage */

    wsptr[8 * 0] = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1] = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2] = (int)(tmp22 + tmp12);
    wsptr[8 * 7] = (int)(tmp22 - tmp12);
    wsptr[8 * 3] = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6] = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4] = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5] = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 10 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 10; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z3 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    z4 = (JLONG)wsptr[4];
    z1 = MULTIPLY(z4, FIX(1.144122806));         /* c4 */
    z2 = MULTIPLY(z4, FIX(0.437016024));         /* c8 */
    tmp10 = z3 + z1;
    tmp11 = z3 - z2;

    tmp22 = z3 - LEFT_SHIFT(z1 - z2, 1);         /* c0 = (c4-c8)*2 */

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));    /* c6 */
    tmp12 = z1 + MULTIPLY(z2, FIX(0.513743148)); /* c2-c6 */
    tmp13 = z1 - MULTIPLY(z3, FIX(2.176250899)); /* c2+c6 */

    tmp20 = tmp10 + tmp12;
    tmp24 = tmp10 - tmp12;
    tmp21 = tmp11 + tmp13;
    tmp23 = tmp11 - tmp13;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    z4 = (JLONG)wsptr[7];

    tmp11 = z2 + z4;
    tmp13 = z2 - z4;

    tmp12 = MULTIPLY(tmp13, FIX(0.309016994));        /* (c3-c7)/2 */

    z2 = MULTIPLY(tmp11, FIX(0.951056516));           /* (c3+c7)/2 */
    z4 = z3 + tmp12;

    tmp10 = MULTIPLY(z1, FIX(1.396802247)) + z2 + z4; /* c1 */
    tmp14 = MULTIPLY(z1, FIX(0.221231742)) - z2 + z4; /* c9 */

    z2 = MULTIPLY(tmp11, FIX(0.587785252));           /* (c1-c9)/2 */
    z4 = z3 - tmp12 - LEFT_SHIFT(tmp13, CONST_BITS - 1);

    tmp12 = LEFT_SHIFT(z1 - tmp13, CONST_BITS) - z3;

    tmp11 = MULTIPLY(z1, FIX(1.260073511)) - z2 - z4; /* c3 */
    tmp13 = MULTIPLY(z1, FIX(0.642039522)) - z2 + z4; /* c7 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[9] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[8] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}